

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::GrowArrayHeadHelperForUnshift<int>
               (JavascriptArray *pArr,uint32 unshiftElements,ScriptContext *scriptContext)

{
  SparseArraySegmentBase *seg;
  Recycler *recycler;
  SparseArraySegmentBase *this;
  bool bVar1;
  SparseArraySegmentBase *pSVar2;
  
  seg = (pArr->head).ptr;
  pSVar2 = (seg->next).ptr;
  recycler = scriptContext->recycler;
  bVar1 = IsInlineSegment(seg,pArr);
  if (pSVar2 == (SparseArraySegmentBase *)0x0) {
    EnsureHead<int>(pArr);
    pSVar2 = &SparseArraySegment<int>::GrowByMin
                        ((SparseArraySegment<int> *)(pArr->head).ptr,recycler,unshiftElements)->
              super_SparseArraySegmentBase;
  }
  else {
    this = (pArr->head).ptr;
    pSVar2 = &SparseArraySegment<int>::GrowByMinMax
                        ((SparseArraySegment<int> *)this,recycler,unshiftElements,
                         (pSVar2->left + unshiftElements) -
                         (((SparseArraySegmentBase *)&this->left)->left + this->size))->
              super_SparseArraySegmentBase;
  }
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(&pArr->head,pSVar2);
  if (bVar1) {
    (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,seg,0);
    return;
  }
  return;
}

Assistant:

void JavascriptArray::GrowArrayHeadHelperForUnshift(JavascriptArray* pArr, uint32 unshiftElements, ScriptContext * scriptContext)
    {
        SparseArraySegmentBase* nextToHeadSeg = pArr->head->next;
        Recycler* recycler = scriptContext->GetRecycler();

        SparseArraySegmentBase *oldHead = pArr->head;
        bool isInlineSegment = JavascriptArray::IsInlineSegment(oldHead, pArr);
        if (nextToHeadSeg == nullptr)
        {
            pArr->EnsureHead<T>();
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMin(recycler, unshiftElements);
        }
        else
        {
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMinMax(recycler, unshiftElements, ((nextToHeadSeg->left + unshiftElements) - pArr->head->left - pArr->head->size));
        }

        if (isInlineSegment)
        {
            pArr->ClearElements(oldHead, 0);
        }
    }